

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenubar.cpp
# Opt level: O3

void __thiscall
QMenuBarPrivate::popupAction(QMenuBarPrivate *this,QAction *action,bool activateFirst)

{
  QWidget *this_00;
  Data *pDVar1;
  int *piVar2;
  QWidgetPrivate *this_01;
  char cVar3;
  LayoutDirection LVar4;
  int iVar5;
  long lVar6;
  QObject *pQVar7;
  Data *pDVar8;
  undefined8 uVar9;
  QWidget *this_02;
  QPoint QVar10;
  QPoint QVar11;
  QPoint QVar12;
  QPoint QVar13;
  int iVar14;
  int iVar15;
  Representation RVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  ExternalRefCountData *tmp;
  long in_FS_OFFSET;
  QRect QVar22;
  undefined1 auVar23 [16];
  int local_90;
  QPoint local_68;
  QPoint local_60;
  undefined1 local_58 [24];
  QPoint local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (action == (QAction *)0x0) goto LAB_00464b0c;
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  QAction::menuObject();
  lVar6 = QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
  if ((lVar6 == 0) || ((this->field_0x298 & 2) != 0)) goto LAB_00464b0c;
  this->field_0x2a0 = this->field_0x2a0 | 1;
  cVar3 = QAction::isEnabled();
  if (cVar3 != '\0') {
    QAction::menuObject();
    lVar6 = QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
    if ((*(byte *)(*(long *)(lVar6 + 0x20) + 8) & 1) == 0) {
      this->field_0x298 = this->field_0x298 & 0xfd;
      QAction::menuObject();
      pQVar7 = (QObject *)QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
      if (pQVar7 == (QObject *)0x0) {
        pDVar8 = (Data *)0x0;
      }
      else {
        pDVar8 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(pQVar7);
      }
      pDVar1 = (this->activeMenu).wp.d;
      (this->activeMenu).wp.d = pDVar8;
      (this->activeMenu).wp.value = pQVar7;
      if (pDVar1 != (Data *)0x0) {
        LOCK();
        *(int *)pDVar1 = *(int *)pDVar1 + -1;
        UNLOCK();
        if (*(int *)pDVar1 == 0) {
          operator_delete(pDVar1);
        }
        pQVar7 = (this->activeMenu).wp.value;
      }
      lVar6 = *(long *)(pQVar7 + 8);
      if (this_00 == (QWidget *)0x0) {
        uVar9 = 0;
      }
      else {
        uVar9 = QtSharedPointer::ExternalRefCountData::getAndRef(&this_00->super_QObject);
      }
      piVar2 = *(int **)(lVar6 + 0x2f8);
      *(undefined8 *)(lVar6 + 0x2f8) = uVar9;
      *(QWidget **)(lVar6 + 0x300) = this_00;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          operator_delete(piVar2);
        }
      }
      uVar9 = QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)action);
      piVar2 = *(int **)(lVar6 + 0x308);
      *(undefined8 *)(lVar6 + 0x308) = uVar9;
      *(QAction **)(lVar6 + 0x310) = action;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          operator_delete(piVar2);
        }
      }
      QVar22 = actionRect(this,action);
      uVar18 = (QVar22._8_8_ & 0xffffffff00000000) + 0x100000000;
      local_40 = (QPoint)(QVar22._0_8_ & 0xffffffff | uVar18);
      this_02 = QWidget::window(this_00);
      QWidget::windowHandle(this_02);
      QVar10 = (QPoint)QWindow::screen();
      iVar20 = QVar22.x2.m_i.m_i - QVar22.x1.m_i;
      iVar14 = iVar20 + 1;
      local_58._0_8_ = (uint)(((iVar20 - (iVar14 >> 0x1f)) + 1 >> 1) + QVar22.x1.m_i.m_i) | uVar18;
      QVar11 = QWidget::mapToGlobal(this_00,(QPoint *)local_58);
      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QVar12 = (QPoint)QScreen::virtualSiblingAt(QVar10);
      if ((QVar12 == (QPoint)0x0) ||
         (QVar13 = (QPoint)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)QVar12),
         local_58._0_8_ = QVar13, local_58._8_8_ = QVar12, QVar13 == (QPoint)0x0)) {
        QVar13.xp.m_i = 0;
        QVar13.yp.m_i = 0;
LAB_00464889:
        local_58._0_8_ = QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)QVar10);
        local_58._8_8_ = QVar10;
        if (QVar13 != (QPoint)0x0) {
          LOCK();
          *(int *)QVar13 = *(int *)QVar13 + -1;
          UNLOCK();
          if (*(int *)QVar13 == 0) {
            operator_delete((void *)QVar13);
          }
        }
      }
      else if (*(int *)((long)QVar13 + 4) == 0) goto LAB_00464889;
      QVar10 = *(QPoint *)(lVar6 + 0x410);
      pQVar7 = *(QObject **)(lVar6 + 0x418);
      ((QPoint *)(lVar6 + 0x410))->xp = (Representation)local_58._0_4_;
      ((QPoint *)(lVar6 + 0x410))->yp = (Representation)local_58._4_4_;
      ((QPoint *)(lVar6 + 0x418))->xp = (Representation)local_58._8_4_;
      ((QPoint *)(lVar6 + 0x418))->yp = (Representation)local_58._12_4_;
      local_58._0_8_ = QVar10;
      local_58._8_8_ = pQVar7;
      uVar9 = (**(code **)(*(long *)(this->activeMenu).wp.value + 0x70))();
      local_58._0_16_ = *(undefined1 (*) [16])(lVar6 + 0x410);
      *(QPoint *)(lVar6 + 0x410) = QVar10;
      *(QObject **)(lVar6 + 0x418) = pQVar7;
      QVar10 = QWidget::mapToGlobal(this_00,&local_40);
      local_60.yp.m_i = QVar11.yp.m_i.m_i;
      local_60.xp.m_i = QVar10.xp.m_i.m_i;
      auVar23 = QScreen::geometry();
      if (QVar10.xp.m_i.m_i <= auVar23._0_4_) {
        QVar10 = auVar23._0_8_;
      }
      iVar20 = auVar23._4_4_;
      if (QVar11.yp.m_i.m_i <= iVar20) {
        QVar11 = auVar23._0_8_;
      }
      local_60 = (QPoint)(((ulong)QVar11 & 0xffffffff00000000) + ((ulong)QVar10 & 0xffffffff));
      iVar21 = (int)((ulong)uVar9 >> 0x20);
      iVar17 = QVar11.yp.m_i.m_i - iVar21;
      iVar19 = QVar11.yp.m_i.m_i + iVar21;
      LVar4 = QWidget::layoutDirection(this_00);
      RVar16 = QVar10.xp.m_i;
      if ((iVar17 < iVar20) && (auVar23._12_4_ < iVar19)) {
        iVar15 = (int)uVar9;
        if (LVar4 == RightToLeft) {
          iVar5 = iVar15;
          if (RVar16.m_i < iVar15) {
LAB_00464a05:
            local_60.xp.m_i = iVar5 + iVar14 + RVar16.m_i;
          }
        }
        else {
          iVar5 = 0;
          local_90 = auVar23._8_4_;
          if (iVar14 + iVar15 + RVar16.m_i <= local_90) goto LAB_00464a05;
          local_60.xp.m_i = RVar16.m_i - iVar15;
        }
      }
      else if (LVar4 == RightToLeft) {
        local_60.xp.m_i = RVar16.m_i + iVar14;
      }
      if ((this->defaultPopDown == 0) || (iVar20 <= iVar17 && auVar23._12_4_ < iVar19)) {
        local_68.yp.m_i = QVar22.y1.m_i.m_i - iVar21;
        local_68.xp.m_i = 0;
        QVar11 = QWidget::mapToGlobal(this_00,&local_68);
        RVar16.m_i = QVar11.yp.m_i.m_i;
        if (QVar11.yp.m_i.m_i < iVar20) {
          RVar16.m_i = iVar20;
        }
        local_60.yp.m_i = RVar16.m_i;
      }
      this_01 = *(QWidgetPrivate **)((this->activeMenu).wp.value + 8);
      QWidgetPrivate::createTLExtra(this_01);
      QWeakPointer<QObject>::operator=
                ((QWeakPointer<QObject> *)
                 ((long)(((this_01->extra)._M_t.
                          super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
                          super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                          super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->topextra)._M_t.
                        super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_> + 0xb8),
                 (QWeakPointer<QObject> *)local_58);
      QMenu::popup((QMenu *)(this->activeMenu).wp.value,&local_60,(QAction *)0x0);
      if (activateFirst) {
        QMenuPrivate::setFirstActionActive(*(QMenuPrivate **)((this->activeMenu).wp.value + 8));
      }
      if ((QPoint)local_58._0_8_ != (QPoint)0x0) {
        LOCK();
        *(int *)local_58._0_8_ = *(int *)local_58._0_8_ + -1;
        UNLOCK();
        if (*(int *)local_58._0_8_ == 0) {
          QVar11 = (QPoint)local_58._0_8_;
          if ((QPoint)local_58._0_8_ == (QPoint)0x0) {
            QVar11.xp.m_i = 0;
            QVar11.yp.m_i = 0;
          }
          operator_delete((void *)QVar11);
        }
      }
    }
  }
  local_58._0_16_ = (undefined1  [16])actionRect(this,action);
  QWidget::update(this_00,(QRect *)local_58);
LAB_00464b0c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMenuBarPrivate::popupAction(QAction *action, bool activateFirst)
{
    Q_Q(QMenuBar);
    if (!action || !action->menu() || closePopupMode)
        return;
    popupState = true;
    if (action->isEnabled() && action->menu()->isEnabled()) {
        closePopupMode = 0;
        activeMenu = action->menu();
        auto *activeMenuPriv = activeMenu->d_func();
        activeMenuPriv->causedPopup.widget = q;
        activeMenuPriv->causedPopup.action = action;

        QRect adjustedActionRect = actionRect(action);
        QPoint popupPos = adjustedActionRect.bottomLeft() + QPoint(0, 1);

        //we put the popup menu on the screen containing the bottom-center of the action rect
        QScreen *menubarScreen = q->window()->windowHandle()->screen();
        QPoint screenTestPos = q->mapToGlobal(popupPos + QPoint(adjustedActionRect.width() / 2, 0));
        QPointer<QScreen> popupScreen = menubarScreen->virtualSiblingAt(screenTestPos);
        if (!popupScreen)
            popupScreen = menubarScreen;
        std::swap(popupScreen, activeMenuPriv->popupScreen);
        const QSize popup_size = activeMenu->sizeHint();
        std::swap(popupScreen, activeMenuPriv->popupScreen);

        // Use screenTestPos.y() for the popup y position. This is the correct global y
        // consistent with the selected screen in cases where the action rect spans
        // multiple screens with different scale factors.
        QPoint pos(q->mapToGlobal(popupPos).x(), screenTestPos.y());

        QRect screenRect = popupScreen->geometry();
        pos = QPoint(qMax(pos.x(), screenRect.x()), qMax(pos.y(), screenRect.y()));
        const bool fitUp = (pos.y() - popup_size.height() >= screenRect.top());
        const bool fitDown = (pos.y() + popup_size.height() <= screenRect.bottom());
        const bool rtl = q->isRightToLeft();
        const int actionWidth = adjustedActionRect.width();

        if (!fitUp && !fitDown) { //we should shift the menu
            bool shouldShiftToRight = !rtl;
            if (rtl && popup_size.width() > pos.x())
                shouldShiftToRight = true;
            else if (actionWidth + popup_size.width() + pos.x() > screenRect.right())
                shouldShiftToRight = false;

            if (shouldShiftToRight) {
                pos.rx() += actionWidth + (rtl ? popup_size.width() : 0);
            } else {
                //shift to left
                if (!rtl)
                    pos.rx() -= popup_size.width();
            }
        } else if (rtl) {
            pos.rx() += actionWidth;
        }

        if (!defaultPopDown || (fitUp && !fitDown))
            pos.setY(qMax(screenRect.y(), q->mapToGlobal(QPoint(0, adjustedActionRect.top()-popup_size.height())).y()));
        QMenuPrivate::get(activeMenu)->topData()->initialScreen = popupScreen;
        activeMenu->popup(pos);
        if (activateFirst)
            activeMenu->d_func()->setFirstActionActive();
    }
    q->update(actionRect(action));
}